

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

string * __thiscall
cmGlobalNinjaGenerator::ninjaCmd_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this)

{
  cmLocalGenerator *pcVar1;
  cmMakefile *this_00;
  char *pcVar2;
  allocator local_69;
  string local_68;
  string local_48;
  
  pcVar1 = *(this->super_cmGlobalGenerator).LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pcVar1 == (cmLocalGenerator *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"ninja","");
  }
  else {
    this_00 = pcVar1->Makefile;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CMAKE_MAKE_PROGRAM","");
    pcVar2 = cmMakefile::GetRequiredDefinition(this_00,&local_68);
    std::__cxx11::string::string((string *)&local_48,pcVar2,&local_69);
    cmOutputConverter::ConvertToOutputFormat
              (__return_storage_ptr__,&pcVar1->super_cmOutputConverter,&local_48,SHELL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::ninjaCmd() const
{
  cmLocalGenerator* lgen = this->LocalGenerators[0];
  if (lgen) {
    return lgen->ConvertToOutputFormat(
             lgen->GetMakefile()->GetRequiredDefinition("CMAKE_MAKE_PROGRAM"),
                                    cmLocalGenerator::SHELL);
  }
  return "ninja";
}